

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BatchedMatMulLayerParams::Clear(BatchedMatMulLayerParams *this)

{
  if (this->weights_ != (WeightParams *)0x0) {
    (*(this->weights_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->weights_ = (WeightParams *)0x0;
  if (this->bias_ != (WeightParams *)0x0) {
    (*(this->bias_->super_MessageLite)._vptr_MessageLite[1])();
  }
  *(undefined8 *)((long)&this->weightmatrixfirstdimension_ + 4) = 0;
  *(undefined8 *)((long)&this->weightmatrixseconddimension_ + 4) = 0;
  this->bias_ = (WeightParams *)0x0;
  this->weightmatrixfirstdimension_ = 0;
  return;
}

Assistant:

void BatchedMatMulLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.BatchedMatMulLayerParams)
  if (GetArenaNoVirtual() == NULL && weights_ != NULL) {
    delete weights_;
  }
  weights_ = NULL;
  if (GetArenaNoVirtual() == NULL && bias_ != NULL) {
    delete bias_;
  }
  bias_ = NULL;
  ::memset(&weightmatrixfirstdimension_, 0, reinterpret_cast<char*>(&int8dynamicquantize_) -
    reinterpret_cast<char*>(&weightmatrixfirstdimension_) + sizeof(int8dynamicquantize_));
}